

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow *under_this_window,ImGuiWindow *ignore_window)

{
  uint uVar1;
  ImGuiWindow *ref_window;
  ImGuiContext *pIVar2;
  ImGuiID IVar3;
  ImGuiContext *g;
  uint uVar4;
  ulong uVar5;
  ImGuiWindow *pIVar6;
  
  pIVar2 = GImGui;
  uVar1 = (GImGui->WindowsFocusOrder).Size;
  if (under_this_window != (ImGuiWindow *)0x0) {
    uVar5 = (ulong)uVar1;
    uVar4 = uVar1;
    do {
      uVar5 = uVar5 - 1;
      if ((int)uVar4 < 1) goto LAB_001d65aa;
      uVar4 = uVar4 - 1;
    } while ((GImGui->WindowsFocusOrder).Data[uVar5 & 0xffffffff] != under_this_window);
    if (uVar4 != 0xffffffff) goto LAB_001d65ac;
  }
LAB_001d65aa:
  uVar4 = uVar1;
LAB_001d65ac:
  if (0 < (int)uVar4) {
    uVar5 = (ulong)uVar4 + 1;
    do {
      pIVar6 = (GImGui->WindowsFocusOrder).Data[uVar5 - 2];
      if (((pIVar6 != ignore_window) && (pIVar6->WasActive == true)) &&
         ((~pIVar6->Flags & 0x40200U) != 0 && (pIVar6->Flags & 0x1000000U) == 0)) {
        ref_window = pIVar6->NavLastChildNavWindow;
        if ((ref_window != (ImGuiWindow *)0x0) && (ref_window->WasActive != false)) {
          if (GImGui->NavWindow != ref_window) {
            GImGui->NavWindow = ref_window;
            if (ref_window == (ImGuiWindow *)0x0) {
              pIVar2->NavInitRequest = false;
              IVar3 = 0;
            }
            else {
              if (pIVar2->NavDisableMouseHover == true) {
                pIVar2->NavMousePosDirty = true;
              }
              pIVar2->NavInitRequest = false;
              IVar3 = ref_window->NavLastIds[0];
            }
            pIVar2->NavId = IVar3;
            pIVar2->NavFocusScopeId = 0;
            pIVar2->NavIdIsAlive = false;
            pIVar2->NavLayer = ImGuiNavLayer_Main;
          }
          pIVar6 = (ImGuiWindow *)0x0;
          ClosePopupsOverWindow(ref_window,false);
          if (ref_window != (ImGuiWindow *)0x0) {
            pIVar6 = ref_window->RootWindow;
          }
          if (((pIVar2->ActiveId != 0) && (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
             ((pIVar2->ActiveIdWindow->RootWindow != pIVar6 &&
              (pIVar2->ActiveIdNoClearOnFocusLoss == false)))) {
            SetActiveID(0,(ImGuiWindow *)0x0);
          }
          if (ref_window != (ImGuiWindow *)0x0) {
            BringWindowToFocusFront(pIVar6);
            if (((uint)(pIVar6->Flags | ref_window->Flags) >> 0xd & 1) == 0) {
              BringWindowToDisplayFront(pIVar6);
              return;
            }
          }
          return;
        }
        FocusWindow(pIVar6);
        return;
      }
      uVar5 = uVar5 - 1;
    } while (1 < uVar5);
  }
  FocusWindow((ImGuiWindow *)0x0);
  return;
}

Assistant:

void ImGui::FocusTopMostWindowUnderOne(ImGuiWindow* under_this_window, ImGuiWindow* ignore_window)
{
    ImGuiContext& g = *GImGui;

    int start_idx = g.WindowsFocusOrder.Size - 1;
    if (under_this_window != NULL)
    {
        int under_this_window_idx = FindWindowFocusIndex(under_this_window);
        if (under_this_window_idx != -1)
            start_idx = under_this_window_idx - 1;
    }
    for (int i = start_idx; i >= 0; i--)
    {
        // We may later decide to test for different NoXXXInputs based on the active navigation input (mouse vs nav) but that may feel more confusing to the user.
        ImGuiWindow* window = g.WindowsFocusOrder[i];
        if (window != ignore_window && window->WasActive && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            if ((window->Flags & (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs)) != (ImGuiWindowFlags_NoMouseInputs | ImGuiWindowFlags_NoNavInputs))
            {
                ImGuiWindow* focus_window = NavRestoreLastChildNavWindow(window);
                FocusWindow(focus_window);
                return;
            }
    }
    FocusWindow(NULL);
}